

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider_p.h
# Opt level: O3

void __thiscall QMimeProviderBase::~QMimeProviderBase(QMimeProviderBase *this)

{
  Data *pDVar1;
  
  this->_vptr_QMimeProviderBase = (_func_int **)&PTR__QMimeProviderBase_006a3000;
  pDVar1 = (this->m_directory).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->m_directory).d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

virtual ~QMimeProviderBase() = default;